

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O1

void av1_update_noise_estimate(AV1_COMP *cpi)

{
  int iVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  uint8_t *puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  byte bVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  NOISE_LEVEL NVar12;
  uint uVar13;
  int iVar14;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  bool bVar27;
  uint hist_avg [20];
  uint local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint local_88 [22];
  int iVar15;
  
  iVar16 = (cpi->common).width;
  iVar24 = 0x28;
  if ((iVar16 < 0x161) && (iVar24 = 0x28, (cpi->common).height < 0x121)) {
    iVar24 = 0x3c;
  }
  iVar14 = (cpi->resize_pending_params).width;
  bVar4 = true;
  bVar27 = true;
  if (iVar14 != 0) {
    iVar15 = (cpi->resize_pending_params).height;
    bVar27 = true;
    if (iVar15 != 0) {
      if (iVar16 == iVar14) {
        bVar27 = (cpi->common).height == iVar15;
      }
      else {
        bVar27 = false;
      }
    }
  }
  iVar14 = 0;
  iVar15 = 0;
  if ((((((((cpi->common).seq_params)->use_highbitdepth == '\0') &&
         ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) &&
       ((iVar14 = iVar15, (cpi->oxcf).q_cfg.aq_mode == '\x03' &&
        ((bool)(4 < (cpi->oxcf).speed & bVar27))))) && (cpi->ppi->use_svc == 0)) &&
     (((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN &&
      (0x383ff < (cpi->common).height * iVar16)))) {
    iVar14 = 1;
    bVar4 = false;
  }
  uVar23 = (cpi->common).current_frame.frame_number;
  pYVar2 = cpi->last_source;
  (cpi->noise_estimate).enabled = iVar14;
  iVar14 = (cpi->svc).number_spatial_layers;
  if (1 < iVar14) {
    uVar23 = (cpi->svc).current_superframe;
  }
  if (((bVar4) || (pYVar2 == (YV12_BUFFER_CONFIG *)0x0 || (uVar23 & 7) != 0)) ||
     ((iVar14 == 1 &&
      (((cpi->noise_estimate).last_w != iVar16 ||
       ((cpi->noise_estimate).last_h != (cpi->common).height)))))) {
    if (pYVar2 != (YV12_BUFFER_CONFIG *)0x0) {
      (cpi->noise_estimate).last_w = iVar16;
      (cpi->noise_estimate).last_h = (cpi->common).height;
    }
  }
  else if (((((int)uVar23 < 0x3d) || ((cpi->svc).num_encoded_top_layer < 2)) ||
           ((cpi->rc).frames_since_key <= iVar14)) ||
          (((cpi->svc).spatial_layer_id != iVar14 + -1 || (iVar24 <= (cpi->rc).avg_frame_low_motion)
           ))) {
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    iVar16 = (cpi->common).mi_params.mi_rows;
    if ((long)iVar16 < 1) {
      iVar24 = 0;
    }
    else {
      iVar14 = (cpi->common).mi_params.mi_cols;
      lVar17 = 0;
      uVar19 = 0;
      iVar24 = 0;
      do {
        if (0 < iVar14) {
          pbVar20 = cpi->consec_zero_mv + lVar17;
          lVar21 = 0;
          do {
            iVar24 = (iVar24 + 1) - (uint)(*pbVar20 < 3);
            lVar21 = lVar21 + 2;
            pbVar20 = pbVar20 + 1;
          } while (lVar21 < iVar14);
        }
        uVar19 = uVar19 + 2;
        lVar17 = lVar17 + (iVar14 >> 1);
      } while (uVar19 < (ulong)(long)iVar16);
    }
    if (0 < (cpi->common).mi_params.mi_rows) {
      puVar25 = (cpi->source->field_5).buffers[0];
      iVar14 = (cpi->source->field_4).field_0.y_stride;
      puVar26 = (pYVar2->field_5).buffers[0];
      iVar15 = (pYVar2->field_4).field_0.y_stride;
      iVar1 = (cpi->common).mi_params.mi_cols;
      uVar23 = 0;
      do {
        iVar9 = (cpi->common).mi_params.mi_cols;
        if (0 < iVar9) {
          uVar22 = uVar23 >> 1;
          uVar19 = 0;
          local_dc = uVar22;
          do {
            uVar13 = (uint)uVar19;
            if ((((uVar13 | uVar23) & 7) == 0) &&
               ((int)uVar13 < iVar9 + -3 && (int)uVar23 < (cpi->common).mi_params.mi_rows + -3)) {
              iVar11 = (int)(uVar19 >> 1) + (iVar9 >> 1) * uVar22;
              puVar3 = cpi->consec_zero_mv;
              lVar17 = (long)((iVar9 >> 1) + iVar11);
              bVar7 = puVar3[lVar17 + 1];
              if (puVar3[lVar17] < puVar3[lVar17 + 1]) {
                bVar7 = puVar3[lVar17];
              }
              if (puVar3[(long)iVar11 + 1] < bVar7) {
                bVar7 = puVar3[(long)iVar11 + 1];
              }
              if (puVar3[iVar11] < bVar7) {
                bVar7 = puVar3[iVar11];
              }
              if (((iVar16 * iVar1 * 3 >> 5 <= iVar24) && (2 < bVar7)) &&
                 ((cpi->rc).high_source_sad == 0)) {
                uVar8 = (*cpi->ppi->fn_ptr[6].vf)(puVar25,iVar14,puVar26,iVar15,local_88);
                uVar22 = local_dc;
                if (uVar8 < 2000) {
                  piVar10 = (int *)(local_d8 + (uVar8 / 0x19 & 0xfffffffc));
                }
                else {
                  piVar10 = (int *)(local_98 + 0xc);
                  if (2999 < uVar8) goto LAB_002553a6;
                }
                *piVar10 = *piVar10 + 1;
              }
            }
LAB_002553a6:
            puVar25 = puVar25 + 4;
            puVar26 = puVar26 + 4;
            uVar19 = (ulong)(uVar13 + 1);
            iVar9 = (cpi->common).mi_params.mi_cols;
          } while ((int)(uVar13 + 1) < iVar9);
        }
        puVar25 = puVar25 + (iVar14 - iVar9) * 4;
        puVar26 = puVar26 + (iVar15 - iVar9) * 4;
        uVar23 = uVar23 + 1;
      } while ((int)uVar23 < (cpi->common).mi_params.mi_rows);
    }
    auVar5 = local_c8;
    auVar6 = local_d8._0_12_;
    iVar16 = (cpi->common).height;
    (cpi->noise_estimate).last_w = (cpi->common).width;
    (cpi->noise_estimate).last_h = iVar16;
    if ((10 < (uint)local_d8._0_4_) && ((uint)local_d8._0_4_ >> 2 < (uint)local_98._12_4_)) {
      auVar6._4_4_ = local_d8._8_4_ >> 2;
      auVar6._0_4_ = local_d8._4_4_ >> 2;
      auVar6._8_4_ = (uint)local_d8._12_4_ >> 2;
      local_d8._0_12_ = auVar6 << 0x20;
      uVar23 = local_c8._0_4_;
      local_c8._4_4_ = local_c8._4_4_ >> 1;
      local_c8._0_4_ = uVar23 >> 1;
      local_c8._8_4_ = auVar5._8_4_;
      local_c8._12_4_ = auVar5._12_4_;
      local_c8._8_4_ = (uint)(local_c8._8_4_ * 3) >> 1;
      local_98._12_4_ = (uint)local_98._12_4_ >> 1;
      auVar6 = local_d8._0_12_;
    }
    local_d8._0_12_ = auVar6;
    uVar18 = 0;
    uVar19 = 0;
    uVar23 = 0;
    do {
      iVar16 = (int)uVar18;
      if (iVar16 == 0x13) {
        local_88[0x13] = (uint)local_98._12_4_ >> 2;
      }
      else if (iVar16 == 0x12) {
        local_88[0x12] = local_98._8_4_ * 2 + local_98._4_4_ + ((uint)local_98._12_4_ >> 1) + 2 >> 2
        ;
      }
      else if (iVar16 == 0) {
        local_88[0] = (uint)(local_d8._4_4_ + local_d8._0_4_ + local_d8._8_4_) / 3;
      }
      else {
        local_88[uVar18] =
             *(int *)(local_d8 + uVar18 * 4) * 2 + *(int *)(local_d8 + uVar18 * 4 + -4) +
             *(int *)(local_d8 + uVar18 * 4 + 4) + 2U >> 2;
      }
      if (uVar23 < local_88[uVar18]) {
        uVar19 = uVar18 & 0xffffffff;
        uVar23 = local_88[uVar18];
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x14);
    uVar23 = (uint)((cpi->noise_estimate).value * 3 + (int)uVar19 * 0x28) >> 2;
    (cpi->noise_estimate).value = uVar23;
    if (((cpi->noise_estimate).level < kMedium) &&
       ((cpi->noise_estimate).adapt_thresh < (int)uVar23)) {
      (cpi->noise_estimate).count = (cpi->noise_estimate).num_frames_estimate;
    }
    else {
      piVar10 = &(cpi->noise_estimate).count;
      *piVar10 = *piVar10 + 1;
    }
    if ((cpi->noise_estimate).count == (cpi->noise_estimate).num_frames_estimate) {
      (cpi->noise_estimate).num_frames_estimate = 0x1e;
      (cpi->noise_estimate).count = 0;
      iVar16 = (cpi->noise_estimate).value;
      iVar24 = (cpi->noise_estimate).thresh;
      NVar12 = kHigh;
      if ((iVar16 == iVar24 * 2 || SBORROW4(iVar16,iVar24 * 2) != iVar16 + iVar24 * -2 < 0) &&
         (NVar12 = kMedium, iVar16 <= iVar24)) {
        NVar12 = (NOISE_LEVEL)(iVar24 >> 1 < iVar16);
      }
      (cpi->noise_estimate).level = NVar12;
    }
  }
  else {
    (cpi->noise_estimate).level = kLowLow;
    (cpi->noise_estimate).count = 0;
    (cpi->noise_estimate).num_frames_estimate = 10;
  }
  return;
}

Assistant:

void av1_update_noise_estimate(AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  NOISE_ESTIMATE *const ne = &cpi->noise_estimate;
  const int low_res = (cm->width <= 352 && cm->height <= 288);
  // Estimate of noise level every frame_period frames.
  int frame_period = 8;
  int thresh_consec_zeromv = 2;
  int frame_counter = cm->current_frame.frame_number;
  // Estimate is between current source and last source.
  YV12_BUFFER_CONFIG *last_source = cpi->last_source;
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi)) {
    last_source = &cpi->denoiser.last_source;
    // Tune these thresholds for different resolutions when denoising is
    // enabled.
    if (cm->width > 640 && cm->width <= 1920) {
      thresh_consec_zeromv = 2;
    }
  }
#endif
  ne->enabled = enable_noise_estimation(cpi);
  if (cpi->svc.number_spatial_layers > 1)
    frame_counter = cpi->svc.current_superframe;
  if (!ne->enabled || frame_counter % frame_period != 0 ||
      last_source == NULL ||
      (cpi->svc.number_spatial_layers == 1 &&
       (ne->last_w != cm->width || ne->last_h != cm->height))) {
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
      copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
    if (last_source != NULL) {
      ne->last_w = cm->width;
      ne->last_h = cm->height;
    }
    return;
  } else if (frame_counter > 60 && cpi->svc.num_encoded_top_layer > 1 &&
             cpi->rc.frames_since_key > cpi->svc.number_spatial_layers &&
             cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
             cpi->rc.avg_frame_low_motion < (low_res ? 60 : 40)) {
    // Force noise estimation to 0 and denoiser off if content has high motion.
    ne->level = kLowLow;
    ne->count = 0;
    ne->num_frames_estimate = 10;
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi) &&
        cpi->svc.current_superframe > 1) {
      av1_denoiser_set_noise_level(cpi, ne->level);
      copy_frame(&cpi->denoiser.last_source, cpi->source);
    }
#endif
    return;
  } else {
    unsigned int bin_size = 100;
    unsigned int hist[MAX_VAR_HIST_BINS] = { 0 };
    unsigned int hist_avg[MAX_VAR_HIST_BINS];
    unsigned int max_bin = 0;
    unsigned int max_bin_count = 0;
    unsigned int bin_cnt;
    BLOCK_SIZE bsize = BLOCK_16X16;
    // Loop over sub-sample of 16x16 blocks of frame, and for blocks that have
    // been encoded as zero/small mv at least x consecutive frames, compute
    // the variance to update estimate of noise in the source.
    const uint8_t *src_y = cpi->source->y_buffer;
    const int src_ystride = cpi->source->y_stride;
    const uint8_t *last_src_y = last_source->y_buffer;
    const int last_src_ystride = last_source->y_stride;
    int mi_row, mi_col;
    int num_low_motion = 0;
    int frame_low_motion = 1;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row += 2) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col += 2) {
        int bl_index =
            (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
        if (cpi->consec_zero_mv[bl_index] > thresh_consec_zeromv)
          num_low_motion++;
      }
    }
    if (num_low_motion <
        (((3 * (mi_params->mi_rows * mi_params->mi_cols) >> 2)) >> 3))
      frame_low_motion = 0;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row++) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col++) {
        // 16x16 blocks, 1/4 sample of frame.
        if (mi_row % 8 == 0 && mi_col % 8 == 0 &&
            mi_row < mi_params->mi_rows - 3 &&
            mi_col < mi_params->mi_cols - 3) {
          int bl_index =
              (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
          int bl_index1 = bl_index + 1;
          int bl_index2 = bl_index + (mi_params->mi_cols >> 1);
          int bl_index3 = bl_index2 + 1;
          int consec_zeromv =
              AOMMIN(cpi->consec_zero_mv[bl_index],
                     AOMMIN(cpi->consec_zero_mv[bl_index1],
                            AOMMIN(cpi->consec_zero_mv[bl_index2],
                                   cpi->consec_zero_mv[bl_index3])));
          // Only consider blocks that are likely steady background. i.e, have
          // been encoded as zero/low motion x (= thresh_consec_zeromv) frames
          // in a row. consec_zero_mv[] defined for 8x8 blocks, so consider all
          // 4 sub-blocks for 16x16 block. And exclude this frame if
          // high_source_sad is true (i.e., scene/content change).
          if (frame_low_motion && consec_zeromv > thresh_consec_zeromv &&
              !cpi->rc.high_source_sad) {
            unsigned int sse;
            // Compute variance between co-located blocks from current and
            // last input frames.
            unsigned int variance = cpi->ppi->fn_ptr[bsize].vf(
                src_y, src_ystride, last_src_y, last_src_ystride, &sse);
            unsigned int hist_index = variance / bin_size;
            if (hist_index < MAX_VAR_HIST_BINS)
              hist[hist_index]++;
            else if (hist_index < 3 * (MAX_VAR_HIST_BINS >> 1))
              hist[MAX_VAR_HIST_BINS - 1]++;  // Account for the tail
          }
        }
        src_y += 4;
        last_src_y += 4;
      }
      src_y += (src_ystride << 2) - (mi_params->mi_cols << 2);
      last_src_y += (last_src_ystride << 2) - (mi_params->mi_cols << 2);
    }
    ne->last_w = cm->width;
    ne->last_h = cm->height;
    // Adjust histogram to account for effect that histogram flattens
    // and shifts to zero as scene darkens.
    if (hist[0] > 10 && (hist[MAX_VAR_HIST_BINS - 1] > hist[0] >> 2)) {
      hist[0] = 0;
      hist[1] >>= 2;
      hist[2] >>= 2;
      hist[3] >>= 2;
      hist[4] >>= 1;
      hist[5] >>= 1;
      hist[6] = 3 * hist[6] >> 1;
      hist[MAX_VAR_HIST_BINS - 1] >>= 1;
    }

    // Average hist[] and find largest bin
    for (bin_cnt = 0; bin_cnt < MAX_VAR_HIST_BINS; bin_cnt++) {
      if (bin_cnt == 0)
        hist_avg[bin_cnt] = (hist[0] + hist[1] + hist[2]) / 3;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 1)
        hist_avg[bin_cnt] = hist[MAX_VAR_HIST_BINS - 1] >> 2;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 2)
        hist_avg[bin_cnt] = (hist[bin_cnt - 1] + 2 * hist[bin_cnt] +
                             (hist[bin_cnt + 1] >> 1) + 2) >>
                            2;
      else
        hist_avg[bin_cnt] =
            (hist[bin_cnt - 1] + 2 * hist[bin_cnt] + hist[bin_cnt + 1] + 2) >>
            2;

      if (hist_avg[bin_cnt] > max_bin_count) {
        max_bin_count = hist_avg[bin_cnt];
        max_bin = bin_cnt;
      }
    }
    // Scale by 40 to work with existing thresholds
    ne->value = (int)((3 * ne->value + max_bin * 40) >> 2);
    // Quickly increase VNR strength when the noise level increases suddenly.
    if (ne->level < kMedium && ne->value > ne->adapt_thresh) {
      ne->count = ne->num_frames_estimate;
    } else {
      ne->count++;
    }
    if (ne->count == ne->num_frames_estimate) {
      // Reset counter and check noise level condition.
      ne->num_frames_estimate = 30;
      ne->count = 0;
      ne->level = av1_noise_estimate_extract_level(ne);
#if CONFIG_AV1_TEMPORAL_DENOISING
      if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
        av1_denoiser_set_noise_level(cpi, ne->level);
#endif
    }
  }
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
    copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
}